

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 float32_round_to_int_arm(float32 a,float_status *s)

{
  FloatParts FVar1;
  
  FVar1._8_8_ = (ulong)(a >> 0x17 & 0xff) | (ulong)(a & 0x80000000) << 9;
  FVar1.frac = (ulong)(a & 0x7fffff);
  FVar1 = sf_canonicalize(FVar1,&float32_params,s);
  FVar1 = round_to_int(FVar1,(int)s->float_rounding_mode,0,s);
  FVar1 = round_canonical(FVar1,s,&float32_params);
  return (uint)FVar1.frac & 0x7fffff | (FVar1.exp & 0xffU) << 0x17 |
         (uint)(FVar1._8_8_ >> 9) & 0x80000000;
}

Assistant:

float32 float32_round_to_int(float32 a, float_status *s)
{
    FloatParts pa = float32_unpack_canonical(a, s);
    FloatParts pr = round_to_int(pa, s->float_rounding_mode, 0, s);
    return float32_round_pack_canonical(pr, s);
}